

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_base_boundary_z2_methods<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>>
               (void)

{
  pointer ppEVar1;
  uint uVar2;
  uint *puVar3;
  bool bVar4;
  pointer bg;
  char *__function;
  uint uVar5;
  ulong uVar6;
  pointer ppEVar7;
  long lVar8;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  _Bit_const_iterator __first1;
  _Bit_const_iterator __first1_00;
  _Bit_const_iterator __first1_01;
  _Bit_const_iterator __first1_02;
  _Bit_const_iterator __last1;
  _Bit_const_iterator __last1_00;
  _Bit_const_iterator __last1_01;
  _Bit_const_iterator __last1_02;
  _Bit_const_iterator __first2;
  _Bit_const_iterator __first2_00;
  _Bit_const_iterator __first2_01;
  _Bit_const_iterator __first2_02;
  vector<bool,_std::allocator<bool>_> container;
  vector<bool,_std::allocator<bool>_> veccont;
  pointer local_288;
  char *local_280;
  shared_count sStack_278;
  Column_settings settings;
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
  local_268;
  pointer *local_250;
  stored_size_type local_240;
  stored_size_type *local_238;
  stored_size_type *local_230;
  undefined4 local_224;
  pointer local_220;
  ulong local_218;
  shared_count sStack_210;
  char *local_208;
  Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>
  col;
  vector<unsigned_int,_std::allocator<unsigned_int>_> permutation;
  stored_size_type **local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_268.m_holder.m_start = (pointer)0x100000000;
  local_268.m_holder.m_size = 0x500000002;
  local_268.m_holder.m_capacity = CONCAT44(local_268.m_holder.m_capacity._4_4_,6);
  __l._M_len = 5;
  __l._M_array = (iterator)&local_268;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&container,__l,
             (allocator_type *)&local_220);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>
  ::Naive_vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>
              *)&col,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&container,&settings);
  if (container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    CONCAT44(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._4_4_,
                             container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._0_4_)
                    - (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT17(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._7_1_,
                0x1010000010101);
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,&container);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x290);
  uVar5 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._M_p -
          (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p) * 8 +
          veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar5 < 0) {
    if (col.column_.
        super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
        .super_type.m_holder.m_size != 0) {
      uVar5 = col.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_start
              [col.column_.
               super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
               .super_type.m_holder.m_size - 1]->rowIndex_ + 1;
      goto LAB_001719d3;
    }
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._0_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._4_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._12_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._12_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  else {
LAB_001719d3:
    local_268.m_holder.m_start = (pointer)((ulong)local_268.m_holder.m_start & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&container,(long)(int)uVar5,(bool *)&local_268,(allocator_type *)&local_288);
    ppEVar7 = col.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_start;
    if (col.column_.
        super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
        .super_type.m_holder.m_size != 0) {
      do {
        if (ppEVar7 == (pointer)0x0) goto LAB_00172996;
        uVar2 = (*ppEVar7)->rowIndex_;
        if (uVar5 <= uVar2) break;
        container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] =
             container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f);
        ppEVar7 = ppEVar7 + 1;
      } while (ppEVar7 !=
               col.column_.
               super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
               .super_type.m_holder.m_start +
               col.column_.
               super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
               .super_type.m_holder.m_size);
    }
  }
  __last1.super__Bit_iterator_base._M_p._4_4_ =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p._4_4_;
  __last1.super__Bit_iterator_base._M_p._0_4_ =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p._0_4_;
  __last1.super__Bit_iterator_base._M_offset =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  if ((ulong)container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      (CONCAT44(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._4_4_,
                container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._0_4_) -
      (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first1.super__Bit_iterator_base._8_8_ = 0;
    __first1.super__Bit_iterator_base._M_p =
         container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    bVar4 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1,__last1,__first2);
  }
  else {
    bVar4 = false;
  }
  local_220 = (pointer)CONCAT71(local_220._1_7_,bVar4);
  local_218 = 0;
  sStack_210.pi_ = (sp_counted_base *)0x0;
  local_250 = &local_288;
  local_288 = (pointer)0x17c1a4;
  local_280 = "";
  local_268.m_holder.m_size = local_268.m_holder.m_size & 0xffffffffffffff00;
  local_268.m_holder.m_start = (pointer)&PTR__lazy_ostream_00199830;
  local_268.m_holder.m_capacity = (stored_size_type)&boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion(&local_220,&local_268,&local_60,0x290,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_210);
  if (container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._0_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._4_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x291);
  local_218 = local_218 & 0xffffffffffffff00;
  local_220 = (pointer)&PTR__lazy_ostream_001997f0;
  sStack_210.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_180 = &local_238;
  local_238 = (stored_size_type *)
              col.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_size;
  local_230 = &local_240;
  local_288 = (pointer)CONCAT71(local_288._1_7_,
                                col.column_.
                                super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
                                .super_type.m_holder.m_size == 5);
  local_240 = CONCAT44(local_240._4_4_,5);
  local_280 = (char *)0x0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_58419;
  permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x17824c;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = &local_180;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_offset & 0xffffff00;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_00199738;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._0_4_ = 0x19e120;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._4_4_ = 0;
  local_250 = (pointer *)&local_230;
  local_268.m_holder.m_size = local_268.m_holder.m_size & 0xffffffffffffff00;
  local_268.m_holder.m_start = (pointer)&PTR__lazy_ostream_001997b0;
  local_268.m_holder.m_capacity = (stored_size_type)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_288,&local_220,&permutation,0x291,1,2,2,"col.size()",&container,"5",&local_268);
  boost::detail::shared_count::~shared_count(&sStack_278);
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._0_4_ = 1;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._4_4_ = 4;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 6;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&DAT_500000000;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 2;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._12_4_ = 3;
  __l_00._M_len = 7;
  __l_00._M_array = (iterator)&container;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&permutation,__l_00,(allocator_type *)&local_268);
  ppEVar7 = col.column_.
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_start;
  if (col.column_.
      super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
      .super_type.m_holder.m_size != 0) {
    ppEVar1 = col.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_start +
              col.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_size;
    lVar8 = 0;
    do {
      if ((undefined8 *)
          ((long)col.column_.
                 super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
                 .super_type.m_holder.m_start + lVar8) == (undefined8 *)0x0) goto LAB_00172979;
      puVar3 = *(uint **)((long)col.column_.
                                super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
                                .super_type.m_holder.m_start + lVar8);
      uVar6 = (ulong)*puVar3;
      if ((ulong)((long)permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar6) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        goto LAB_00172979;
      }
      *puVar3 = permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
      lVar8 = lVar8 + 8;
    } while (col.column_.
             super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
             .super_type.m_holder.m_size * 8 - lVar8 != 0);
    if (col.column_.
        super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
        .super_type.m_holder.m_size != 0) {
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p =
           (_Bit_type *)
           col.column_.
           super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
           .super_type.m_holder.m_start;
      lVar8 = 0x3f;
      if (col.column_.
          super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
          .super_type.m_holder.m_size != 0) {
        for (; col.column_.
               super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
               .super_type.m_holder.m_size >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      local_268.m_holder.m_start = ppEVar1;
      std::
      __introsort_loop<boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>**,false>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&,unsigned_int)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>const*)_1_>>
                (&container,&local_268,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
      local_220 = ppEVar7;
      local_288 = ppEVar1;
      std::
      __final_insertion_sort<boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>**,false>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&,unsigned_int)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>const*)_1_>>
                ();
    }
  }
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT17(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._7_1_,
                0x1010100010001);
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,&container);
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x296);
  uVar5 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._M_p -
          (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p) * 8 +
          veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar5 < 0) {
    if (col.column_.
        super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
        .super_type.m_holder.m_size != 0) {
      uVar5 = col.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_start
              [col.column_.
               super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
               .super_type.m_holder.m_size - 1]->rowIndex_ + 1;
      goto LAB_00171e00;
    }
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._0_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._4_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._12_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._12_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  else {
LAB_00171e00:
    local_268.m_holder.m_start = (pointer)((ulong)local_268.m_holder.m_start & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&container,(long)(int)uVar5,(bool *)&local_268,(allocator_type *)&local_288);
    ppEVar7 = col.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_start;
    if (col.column_.
        super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
        .super_type.m_holder.m_size != 0) {
      do {
        if (ppEVar7 == (pointer)0x0) goto LAB_00172996;
        uVar2 = (*ppEVar7)->rowIndex_;
        if (uVar5 <= uVar2) break;
        container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] =
             container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f);
        ppEVar7 = ppEVar7 + 1;
      } while (ppEVar7 !=
               col.column_.
               super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
               .super_type.m_holder.m_start +
               col.column_.
               super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
               .super_type.m_holder.m_size);
    }
  }
  __last1_00.super__Bit_iterator_base._M_p._4_4_ =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p._4_4_;
  __last1_00.super__Bit_iterator_base._M_p._0_4_ =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p._0_4_;
  __last1_00.super__Bit_iterator_base._M_offset =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  if ((ulong)container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      (CONCAT44(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._4_4_,
                container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._0_4_) -
      (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first1_00.super__Bit_iterator_base._8_8_ = 0;
    __first1_00.super__Bit_iterator_base._M_p =
         container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __last1_00.super__Bit_iterator_base._12_4_ = 0;
    __first2_00.super__Bit_iterator_base._8_8_ = 0;
    __first2_00.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    bVar4 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_00,__last1_00,__first2_00);
  }
  else {
    bVar4 = false;
  }
  local_220 = (pointer)CONCAT71(local_220._1_7_,bVar4);
  local_218 = 0;
  sStack_210.pi_ = (sp_counted_base *)0x0;
  local_288 = (pointer)0x17c1a4;
  local_280 = "";
  local_268.m_holder.m_size = local_268.m_holder.m_size & 0xffffffffffffff00;
  local_268.m_holder.m_start = (pointer)&PTR__lazy_ostream_00199830;
  local_268.m_holder.m_capacity = (stored_size_type)&boost::unit_test::lazy_ostream::inst;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_250 = &local_288;
  boost::test_tools::tt_detail::report_assertion(&local_220,&local_268,&local_b0,0x296,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_210);
  if (container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._0_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._4_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x297);
  local_218 = local_218 & 0xffffffffffffff00;
  local_220 = (pointer)&PTR__lazy_ostream_001997f0;
  sStack_210.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_240 = col.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_size;
  local_288 = (pointer)CONCAT71(local_288._1_7_,
                                col.column_.
                                super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
                                .super_type.m_holder.m_size == 5);
  local_224 = 5;
  local_280 = (char *)0x0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_180 = (stored_size_type **)0x1781d9;
  local_178 = "";
  local_230 = &local_240;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_offset & 0xffffff00;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_00199738;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._0_4_ = 0x19e120;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._4_4_ = 0;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = &local_230;
  local_268.m_holder.m_size = local_268.m_holder.m_size & 0xffffffffffffff00;
  local_268.m_holder.m_start = (pointer)&PTR__lazy_ostream_001997b0;
  local_268.m_holder.m_capacity = (stored_size_type)&boost::unit_test::lazy_ostream::inst;
  local_250 = (pointer *)&local_238;
  local_238 = (stored_size_type *)&local_224;
  boost::test_tools::tt_detail::report_assertion
            (&local_288,&local_220,&local_180,0x297,1,2,2,"col.size()",&container,"5",&local_268);
  boost::detail::shared_count::~shared_count(&sStack_278);
  bVar4 = col.column_.
          super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
          .super_type.m_holder.m_size == 0;
  if (!bVar4) {
    lVar8 = col.column_.
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_size << 3;
    ppEVar7 = col.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_start;
    do {
      if (ppEVar7 == (pointer)0x0) goto LAB_00172979;
      if ((*ppEVar7)->rowIndex_ == 2) {
        if (!bVar4) {
          operator_delete(*ppEVar7,4);
          container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)ppEVar7;
          boost::container::
          vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
          ::erase(&local_268,(const_iterator *)&col);
        }
        break;
      }
      ppEVar7 = ppEVar7 + 1;
      lVar8 = lVar8 + -8;
      bVar4 = lVar8 == 0;
    } while (!bVar4);
  }
  bVar4 = col.column_.
          super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
          .super_type.m_holder.m_size == 0;
  if (!bVar4) {
    lVar8 = col.column_.
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_size << 3;
    ppEVar7 = col.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_start;
    do {
      if (ppEVar7 == (pointer)0x0) goto LAB_00172979;
      if ((*ppEVar7)->rowIndex_ == 6) {
        if (!bVar4) {
          operator_delete(*ppEVar7,4);
          container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)ppEVar7;
          boost::container::
          vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
          ::erase(&local_268,(const_iterator *)&col);
        }
        break;
      }
      ppEVar7 = ppEVar7 + 1;
      lVar8 = lVar8 + -8;
      bVar4 = lVar8 == 0;
    } while (!bVar4);
  }
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT17(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._7_1_,0x10100000001)
  ;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,&container);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x29c);
  uVar5 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._M_p -
          (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p) * 8 +
          veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar5 < 0) {
    if (col.column_.
        super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
        .super_type.m_holder.m_size != 0) {
      uVar5 = col.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_start
              [col.column_.
               super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
               .super_type.m_holder.m_size - 1]->rowIndex_ + 1;
      goto LAB_00172245;
    }
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._0_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._4_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._12_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  else {
LAB_00172245:
    local_268.m_holder.m_start = (pointer)((ulong)local_268.m_holder.m_start & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&container,(long)(int)uVar5,(bool *)&local_268,(allocator_type *)&local_288);
    ppEVar7 = col.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_start;
    if (col.column_.
        super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
        .super_type.m_holder.m_size != 0) {
      do {
        if (ppEVar7 == (pointer)0x0) goto LAB_00172996;
        uVar2 = (*ppEVar7)->rowIndex_;
        if (uVar5 <= uVar2) break;
        container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] =
             container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f);
        ppEVar7 = ppEVar7 + 1;
      } while (ppEVar7 !=
               col.column_.
               super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
               .super_type.m_holder.m_start +
               col.column_.
               super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
               .super_type.m_holder.m_size);
    }
  }
  __last1_01.super__Bit_iterator_base._M_p._4_4_ =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p._4_4_;
  __last1_01.super__Bit_iterator_base._M_p._0_4_ =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p._0_4_;
  __last1_01.super__Bit_iterator_base._M_offset =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  if ((container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff) +
      (CONCAT44(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._4_4_,
                container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._0_4_) -
      (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first1_01.super__Bit_iterator_base._8_8_ = 0;
    __first1_01.super__Bit_iterator_base._M_p =
         container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __last1_01.super__Bit_iterator_base._12_4_ = 0;
    __first2_01.super__Bit_iterator_base._8_8_ = 0;
    __first2_01.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    bVar4 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_01,__last1_01,__first2_01);
  }
  else {
    bVar4 = false;
  }
  local_220 = (pointer)CONCAT71(local_220._1_7_,bVar4);
  local_218 = 0;
  sStack_210.pi_ = (sp_counted_base *)0x0;
  local_288 = (pointer)0x17c1a4;
  local_280 = "";
  local_268.m_holder.m_size = local_268.m_holder.m_size & 0xffffffffffffff00;
  local_268.m_holder.m_start = (pointer)&PTR__lazy_ostream_00199830;
  local_268.m_holder.m_capacity = (stored_size_type)&boost::unit_test::lazy_ostream::inst;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  local_250 = &local_288;
  boost::test_tools::tt_detail::report_assertion(&local_220,&local_268,&local_100,0x29c,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_210);
  if (container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._0_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._4_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ =
         container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x29d);
  local_218 = local_218 & 0xffffffffffffff00;
  local_220 = (pointer)&PTR__lazy_ostream_001997f0;
  sStack_210.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_240 = col.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_size;
  local_288 = (pointer)CONCAT71(local_288._1_7_,
                                col.column_.
                                super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
                                .super_type.m_holder.m_size == 3);
  local_224 = 3;
  local_280 = (char *)0x0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_180 = (stored_size_type **)0x1781d9;
  local_178 = "";
  local_230 = &local_240;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_offset & 0xffffff00;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_00199738;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._0_4_ = 0x19e120;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._4_4_ = 0;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = &local_230;
  local_268.m_holder.m_size = local_268.m_holder.m_size & 0xffffffffffffff00;
  local_268.m_holder.m_start = (pointer)&PTR__lazy_ostream_001997b0;
  local_268.m_holder.m_capacity = (stored_size_type)&boost::unit_test::lazy_ostream::inst;
  local_250 = (pointer *)&local_238;
  local_238 = (stored_size_type *)&local_224;
  boost::test_tools::tt_detail::report_assertion
            (&local_288,&local_220,&local_180,0x29d,1,2,2,"col.size()",&container,"3",&local_268);
  boost::detail::shared_count::~shared_count(&sStack_278);
  if (col.column_.
      super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
      .super_type.m_holder.m_size != 0) {
    lVar8 = col.column_.
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_size << 3;
    ppEVar7 = col.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_start;
    do {
      if (ppEVar7 == (pointer)0x0) goto LAB_00172979;
      if (*ppEVar7 !=
          (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>
           *)0x0) {
        operator_delete(*ppEVar7,4);
      }
      ppEVar7 = ppEVar7 + 1;
      lVar8 = lVar8 + -8;
    } while (lVar8 != 0);
  }
  col.column_.
  super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
  .super_type.m_holder.m_size = 0;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&veccont,0,0);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x2a1);
  uVar5 = ((int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._M_p -
          (int)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p) * 8 +
          veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar5 < 0) {
    if (col.column_.
        super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
        .super_type.m_holder.m_size == 0) {
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p._0_4_ = 0;
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p._4_4_ = 0;
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ = 0;
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._12_4_ = 0;
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      goto LAB_00172666;
    }
    uVar5 = col.column_.
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_start
            [col.column_.
             super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
             .super_type.m_holder.m_size - 1]->rowIndex_ + 1;
  }
  local_268.m_holder.m_start = (pointer)((ulong)local_268.m_holder.m_start & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&container,(long)(int)uVar5,(bool *)&local_268,(allocator_type *)&local_288);
  ppEVar7 = col.column_.
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_start;
  if (col.column_.
      super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
      .super_type.m_holder.m_size != 0) {
    do {
      if (ppEVar7 == (pointer)0x0) goto LAB_00172996;
      uVar2 = (*ppEVar7)->rowIndex_;
      if (uVar5 <= uVar2) break;
      container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p[uVar2 >> 6] =
           container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f);
      ppEVar7 = ppEVar7 + 1;
    } while (ppEVar7 !=
             col.column_.
             super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
             .super_type.m_holder.m_start +
             col.column_.
             super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
             .super_type.m_holder.m_size);
  }
LAB_00172666:
  __last1_02.super__Bit_iterator_base._M_p._4_4_ =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p._4_4_;
  __last1_02.super__Bit_iterator_base._M_p._0_4_ =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p._0_4_;
  __last1_02.super__Bit_iterator_base._M_offset =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  if ((container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff) +
      (CONCAT44(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._4_4_,
                container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._0_4_) -
      (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8 ==
      (ulong)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __first1_02.super__Bit_iterator_base._8_8_ = 0;
    __first1_02.super__Bit_iterator_base._M_p =
         container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __last1_02.super__Bit_iterator_base._12_4_ = 0;
    __first2_02.super__Bit_iterator_base._8_8_ = 0;
    __first2_02.super__Bit_iterator_base._M_p =
         veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    bVar4 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_02,__last1_02,__first2_02);
  }
  else {
    bVar4 = false;
  }
  local_220 = (pointer)CONCAT71(local_220._1_7_,bVar4);
  local_218 = 0;
  sStack_210.pi_ = (sp_counted_base *)0x0;
  local_288 = (pointer)0x17c1a4;
  local_280 = "";
  local_268.m_holder.m_size = local_268.m_holder.m_size & 0xffffffffffffff00;
  local_268.m_holder.m_start = (pointer)&PTR__lazy_ostream_00199830;
  local_268.m_holder.m_capacity = (stored_size_type)&boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_148 = "";
  local_250 = &local_288;
  boost::test_tools::tt_detail::report_assertion(&local_220,&local_268,&local_150,0x2a1,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_210);
  if (container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._0_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._4_4_ = 0;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ =
         container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x2a2);
  local_218 = local_218 & 0xffffffffffffff00;
  local_220 = (pointer)&PTR__lazy_ostream_001997f0;
  sStack_210.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_208 = "";
  local_240 = col.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_size;
  local_288 = (pointer)CONCAT71(local_288._1_7_,
                                col.column_.
                                super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
                                .super_type.m_holder.m_size == 0);
  local_224 = 0;
  local_280 = (char *)0x0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_180 = (stored_size_type **)0x1781d9;
  local_178 = "";
  local_230 = &local_240;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset =
       container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_offset & 0xffffff00;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__lazy_ostream_00199738;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._0_4_ = 0x19e120;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p._4_4_ = 0;
  container.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = &local_230;
  local_268.m_holder.m_size = local_268.m_holder.m_size & 0xffffffffffffff00;
  local_268.m_holder.m_start = (pointer)&PTR__lazy_ostream_001997b0;
  local_268.m_holder.m_capacity = (stored_size_type)&boost::unit_test::lazy_ostream::inst;
  local_250 = (pointer *)&local_238;
  local_238 = (stored_size_type *)&local_224;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_278);
  if (permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)permutation.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)permutation.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (col.column_.
      super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
      .super_type.m_holder.m_size != 0) {
    lVar8 = col.column_.
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_size << 3;
    ppEVar7 = col.column_.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_start;
    do {
      if (ppEVar7 == (pointer)0x0) goto LAB_00172979;
      if (*ppEVar7 !=
          (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>
           *)0x0) {
        operator_delete(*ppEVar7,4);
      }
      ppEVar7 = ppEVar7 + 1;
      lVar8 = lVar8 + -8;
    } while (lVar8 != 0);
  }
  if ((col.column_.
       super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
       .super_type.m_holder.m_capacity != 0) &&
     (&col.column_.
       super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
       .m_storage_start !=
      (storage_type *)
      col.column_.
      super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
      .super_type.m_holder.m_start)) {
    operator_delete(col.column_.
                    super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
                    .super_type.m_holder.m_start);
  }
  if (veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)veccont.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
LAB_00172996:
  __function = 
  "reference boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, false, false, false>>> **, true>::operator*() const [Pointer = Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, false, false, false>>> **, IsConst = true]"
  ;
  goto LAB_001729ab;
LAB_00172979:
  __function = 
  "reference boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, false, false, false>>> **, false>::operator*() const [Pointer = Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, false, false, false>>> **, IsConst = false]"
  ;
LAB_001729ab:
  __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,__function);
}

Assistant:

void column_test_base_boundary_z2_methods() {
  std::vector<typename Column::Field_element> veccont;
  typename Column::Column_settings settings;

  Column col(std::vector<unsigned int>{0, 1, 2, 5, 6}, &settings);
  veccont = {1, 1, 1, 0, 0, 1, 1};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 5);

  std::vector<unsigned int> permutation{0, 5, 2, 3, 1, 4, 6};
  col.reorder(permutation);
  veccont = {1, 0, 1, 0, 1, 1, 1};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 5);

  col.clear(2);
  col.clear(6);
  veccont = {1, 0, 0, 0, 1, 1, 0};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 3);

  col.clear();
  veccont = {};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 0);
}